

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch.c
# Opt level: O3

void find_best_pitch(opus_val32 *xcorr,opus_val16 *y,int len,int max_pitch,int *best_pitch)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  best_pitch[0] = 0;
  best_pitch[1] = 1;
  if (len < 1) {
    fVar4 = 1.0;
  }
  else {
    fVar4 = 1.0;
    uVar3 = 0;
    do {
      fVar4 = fVar4 + y[uVar3] * y[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)len != uVar3);
  }
  if (0 < max_pitch) {
    fVar10 = -1.0;
    iVar1 = 0;
    uVar3 = 0;
    fVar8 = 0.0;
    fVar7 = -1.0;
    fVar5 = 0.0;
    do {
      fVar6 = fVar5;
      if ((0.0 < (float)xcorr[uVar3]) &&
         (fVar9 = (float)xcorr[uVar3] * 1e-12, fVar9 = fVar9 * fVar9, fVar4 * fVar7 < fVar8 * fVar9)
         ) {
        iVar2 = (int)uVar3;
        if (fVar5 * fVar9 <= fVar4 * fVar10) {
          best_pitch[1] = iVar2;
          fVar7 = fVar9;
          fVar8 = fVar4;
        }
        else {
          best_pitch[1] = iVar1;
          *best_pitch = iVar2;
          fVar6 = fVar4;
          fVar7 = fVar10;
          fVar8 = fVar5;
          fVar10 = fVar9;
          iVar1 = iVar2;
        }
      }
      fVar5 = fVar4 + (y[(long)len + uVar3] * y[(long)len + uVar3] - y[uVar3] * y[uVar3]);
      fVar4 = 1.0;
      if (1.0 <= fVar5) {
        fVar4 = fVar5;
      }
      uVar3 = uVar3 + 1;
      fVar5 = fVar6;
    } while ((uint)max_pitch != uVar3);
  }
  return;
}

Assistant:

static void find_best_pitch(opus_val32 *xcorr, opus_val16 *y, int len,
                            int max_pitch, int *best_pitch
#ifdef FIXED_POINT
        , int yshift, opus_val32 maxcorr
#endif
) {
    int i, j;
    opus_val32 Syy = 1;
    opus_val16 best_num[2];
    opus_val32 best_den[2];
#ifdef FIXED_POINT
    int xshift;

    xshift = celt_ilog2(maxcorr)-14;
#endif

    best_num[0] = -1;
    best_num[1] = -1;
    best_den[0] = 0;
    best_den[1] = 0;
    best_pitch[0] = 0;
    best_pitch[1] = 1;
    for (j = 0; j < len; j++)
        Syy = ADD32(Syy, SHR32(MULT16_16(y[j], y[j]), yshift));
    for (i = 0; i < max_pitch; i++) {
        if (xcorr[i] > 0) {
            opus_val16 num;
            opus_val32 xcorr16;
            xcorr16 = EXTRACT16(VSHR32(xcorr[i], xshift));
#ifndef FIXED_POINT
            /* Considering the range of xcorr16, this should avoid both underflows
               and overflows (inf) when squaring xcorr16 */
            xcorr16 *= 1e-12f;
#endif
            num = MULT16_16_Q15(xcorr16, xcorr16);
            if (MULT16_32_Q15(num, best_den[1]) > MULT16_32_Q15(best_num[1], Syy)) {
                if (MULT16_32_Q15(num, best_den[0]) > MULT16_32_Q15(best_num[0], Syy)) {
                    best_num[1] = best_num[0];
                    best_den[1] = best_den[0];
                    best_pitch[1] = best_pitch[0];
                    best_num[0] = num;
                    best_den[0] = Syy;
                    best_pitch[0] = i;
                } else {
                    best_num[1] = num;
                    best_den[1] = Syy;
                    best_pitch[1] = i;
                }
            }
        }
        Syy += SHR32(MULT16_16(y[i + len], y[i + len]), yshift) - SHR32(MULT16_16(y[i], y[i]), yshift);
        Syy = MAX32(1, Syy);
    }
}